

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O3

void Abc_SclUpsizePrint(SC_Man *p,int Iter,int win,int nPathPos,int nPathNodes,int nUpsizes,
                       int nTFOs,int fVerbose)

{
  int iVar1;
  long lVar2;
  undefined4 in_register_00000034;
  timespec local_40;
  
  printf("%4d ",CONCAT44(in_register_00000034,Iter));
  printf("Win:%3d. ",(ulong)(uint)win);
  printf("PO:%6d. ",(ulong)(uint)nPathPos);
  printf("Path:%7d. ",(ulong)(uint)nPathNodes);
  printf("Gate:%5d. ",(ulong)(uint)nUpsizes);
  printf("TFO:%7d. ",(ulong)(uint)nTFOs);
  printf("A: ");
  printf("%.2f ",(double)p->SumArea);
  printf("(%+5.1f %%)  ",((double)(p->SumArea - p->SumArea0) * 100.0) / (double)p->SumArea0);
  printf("D: ");
  printf("%.2f ps ",(double)p->MaxDelay);
  printf("(%+5.1f %%)  ",((double)(p->MaxDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  printf("B: ");
  printf("%.2f ps ",(double)p->BestDelay);
  printf("(%+5.1f %%)",((double)(p->BestDelay - p->MaxDelay0) * 100.0) / (double)p->MaxDelay0);
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar2 = -1;
  }
  else {
    lVar2 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  printf("%8.2f sec    ",(double)(lVar2 - p->timeTotal) / 1000000.0);
  putchar((uint)(fVerbose == 0) * 3 + 10);
  return;
}

Assistant:

void Abc_SclUpsizePrint( SC_Man * p, int Iter, int win, int nPathPos, int nPathNodes, int nUpsizes, int nTFOs, int fVerbose )
{
    printf( "%4d ",          Iter );
    printf( "Win:%3d. ",     win );
    printf( "PO:%6d. ",      nPathPos );
    printf( "Path:%7d. ",    nPathNodes );
    printf( "Gate:%5d. ",    nUpsizes );
    printf( "TFO:%7d. ",     nTFOs );
    printf( "A: " );
    printf( "%.2f ",         p->SumArea );
    printf( "(%+5.1f %%)  ", 100.0 * (p->SumArea - p->SumArea0)/ p->SumArea0 );
    printf( "D: " );
    printf( "%.2f ps ",      p->MaxDelay );
    printf( "(%+5.1f %%)  ", 100.0 * (p->MaxDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "B: " );
    printf( "%.2f ps ",      p->BestDelay );
    printf( "(%+5.1f %%)",   100.0 * (p->BestDelay - p->MaxDelay0)/ p->MaxDelay0 );
    printf( "%8.2f sec    ", 1.0*(Abc_Clock() - p->timeTotal)/(CLOCKS_PER_SEC) );
    printf( "%c", fVerbose ? '\n' : '\r' );
}